

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_solution.hpp
# Opt level: O3

Spins * __thiscall
openjij::result::get_solution<openjij::graph::Dense<float>>
          (Spins *__return_storage_ptr__,result *this,
          TransverseIsing<openjij::graph::Dense<float>_> *system)

{
  long lVar1;
  long lVar2;
  pointer piVar3;
  plain_array<float,_1,_0,_0> pVar4;
  plain_array<float,_1,_0,_0> pVar5;
  char *__function;
  long lVar6;
  long lVar7;
  long lVar8;
  Spins *ret_spins;
  DenseStorage<float,_1,_1,_1,_0> local_b0 [2];
  Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0>
  local_a8;
  Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> local_68;
  
  lVar1 = *(long *)(this + 0x10);
  if (lVar1 == 0) {
    lVar6 = 0;
  }
  else {
    lVar8 = 0;
    lVar6 = 0;
    pVar5.array[0] = (float  [1])(float  [1])INFINITY;
    do {
      lVar2 = *(long *)(this + 8);
      if (lVar2 < 0 && *(long *)this != 0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                      "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1, true>, Level = 0]"
                     );
      }
      if (*(long *)(this + 0x10) <= lVar8) {
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                      "Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = const Eigen::Matrix<float, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                     );
      }
      if (lVar2 != *(long *)(this + 0x20)) {
        __function = 
        "Eigen::Product<Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1, true>>, Eigen::Matrix<float, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1, true>>, Rhs = Eigen::Matrix<float, -1, -1, 1>, Option = 0]"
        ;
LAB_00151699:
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,__function);
      }
      local_a8.m_lhs.m_matrix.
      super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
      m_data = (PointerType)(*(long *)this + lVar2 * lVar8 * 4);
      local_a8.m_lhs.m_matrix.
      super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_startRow.m_value = 0;
      local_68.
      super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_startRow.m_value = 0;
      local_a8.m_lhs.m_matrix.
      super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
      m_rows.m_value = lVar2;
      local_a8.m_lhs.m_matrix.
      super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr
           = (XprTypeNested)this;
      local_a8.m_lhs.m_matrix.
      super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_startCol.m_value = lVar8;
      local_a8.m_lhs.m_matrix.
      super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_outerStride = lVar2;
      local_a8.m_rhs = (RhsNested)(this + 0x18);
      local_68.
      super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
      m_data = local_a8.m_lhs.m_matrix.
               super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
               .
               super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
               .m_data;
      local_68.
      super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
      m_rows.m_value = lVar2;
      local_68.
      super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr
           = (XprTypeNested)this;
      local_68.
      super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_startCol.m_value = lVar8;
      local_68.
      super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_outerStride = lVar2;
      if (*(long *)(this + 0x28) != lVar2) {
        __function = 
        "Eigen::Product<Eigen::Product<Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1, true>>, Eigen::Matrix<float, -1, -1, 1>>, Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1, true>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Product<Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1, true>>, Eigen::Matrix<float, -1, -1, 1>>, Rhs = Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1, true>, Option = 0]"
        ;
        goto LAB_00151699;
      }
      Eigen::internal::
      generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,1,true>const>,Eigen::Matrix<float,-1,-1,1,-1,-1>,0>,Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,1,true>,Eigen::DenseShape,Eigen::DenseShape,6>
      ::evalTo<Eigen::Matrix<float,1,1,0,1,1>>
                ((Matrix<float,_1,_1,_0,_1,_1> *)local_b0,&local_a8,&local_68);
      lVar2 = lVar8;
      pVar4.array[0] = (float  [1])(float  [1])local_b0[0].m_data.array[0];
      if ((float)pVar5.array[0] <= (float)local_b0[0].m_data.array[0]) {
        lVar2 = lVar6;
        pVar4.array[0] = pVar5.array[0];
      }
      lVar6 = lVar2;
      lVar8 = lVar8 + 1;
      pVar5.array[0] = pVar4.array[0];
    } while (lVar1 != lVar8);
  }
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,*(size_type *)(this + 0x30),(allocator_type *)&local_a8);
  lVar1 = *(long *)(this + 0x30);
  if (lVar1 != 0) {
    if (lVar6 < 0) {
LAB_0015164e:
      __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                    "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<float, -1, -1>, 0>::operator()(Index, Index) const [Derived = Eigen::Matrix<float, -1, -1>, Level = 0]"
                   );
    }
    lVar8 = *(long *)(this + 8);
    lVar2 = *(long *)this;
    piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      if ((lVar8 <= lVar7) || (*(long *)(this + 0x10) <= lVar6)) goto LAB_0015164e;
      piVar3[lVar7] = (int)*(float *)(lVar8 * lVar6 * 4 + lVar2 + lVar7 * 4);
      lVar7 = lVar7 + 1;
    } while (lVar1 != lVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

const graph::Spins
get_solution(const system::TransverseIsing<GraphType> &system) {
  std::size_t minimum_trotter = 0;
  // aliases
  auto &spins = system.trotter_spins;
  double energy = 0.0;
  double min_energy = std::numeric_limits<double>::max();
  // get number of trotter slices
  std::size_t num_trotter_slices = system.trotter_spins.cols();
  for (std::size_t t = 0; t < num_trotter_slices; t++) {
    // calculate classical energy in each classical spin
    energy = spins.col(t).transpose() * system.interaction * spins.col(t);
    if (energy < min_energy) {
      minimum_trotter = t;
      min_energy = energy;
    }
  }

  // convert from Eigen::Vector to std::vector
  graph::Spins ret_spins(system.num_classical_spins);
  for (std::size_t i = 0; i < system.num_classical_spins; i++) {
    ret_spins[i] = static_cast<graph::Spin>(spins(i, minimum_trotter));
  }
  return ret_spins;
}